

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.h
# Opt level: O0

Unique<Type>_conflict5 __thiscall anurbs::Box<3L>::load(Box<3L> *this,Model *model,Json *source)

{
  Matrix<double,_1,_3,_1,_1,_3> local_e8;
  allocator<char> local_c9;
  string local_c8;
  Matrix<double,_1,_3,_1,_1,_3> local_a8;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  Vector max;
  Vector min;
  DataReader reader;
  Json *source_local;
  Model *model_local;
  
  DataReader::DataReader
            ((DataReader *)
             (min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2),source);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            ((Matrix<double,_1,_3,_1,_1,_3> *)
             (max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"min",&local_79);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            (&local_a8,
             (Matrix<double,_1,_3,_1,_1,_3> *)
             (max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2));
  DataReader::fill_vector<Eigen::Matrix<double,1,3,1,1,3>>
            ((DataReader *)
             (min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2),&local_78,&local_a8);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"max",&local_c9);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_e8,(Matrix<double,_1,_3,_1,_1,_3> *)local_58);
  DataReader::fill_vector<Eigen::Matrix<double,1,3,1,1,3>>
            ((DataReader *)
             (min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2),&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  new_<anurbs::Box<3l>,Eigen::Matrix<double,1,3,1,1,3>&,Eigen::Matrix<double,1,3,1,1,3>&>
            ((anurbs *)this,
             (Matrix<double,_1,_3,_1,_1,_3> *)
             (max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2),(Matrix<double,_1,_3,_1,_1,_3> *)local_58);
  return (__uniq_ptr_data<anurbs::Box<3L>,_std::default_delete<anurbs::Box<3L>_>,_true,_true>)
         (__uniq_ptr_data<anurbs::Box<3L>,_std::default_delete<anurbs::Box<3L>_>,_true,_true>)this;
}

Assistant:

static Unique<Type> load(Model& model, const Json& source)
    {
        const DataReader reader(source);

        Vector min, max;

        reader.fill_vector("min", min);
        reader.fill_vector("max", max);

        return new_<Type>(min, max);
    }